

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatQueue.c
# Opt level: O1

void Msat_QueueInsert(Msat_Queue_t *p,int Lit)

{
  int iVar1;
  
  iVar1 = p->iLast;
  if (iVar1 == p->nVars) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/msat/msatQueue.c"
                  ,0x70,"void Msat_QueueInsert(Msat_Queue_t *, int)");
  }
  if (iVar1 < p->nVars) {
    p->iLast = iVar1 + 1;
    p->pVars[iVar1] = Lit;
    return;
  }
  __assert_fail("p->iLast < p->nVars",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/msat/msatQueue.c"
                ,0x74,"void Msat_QueueInsert(Msat_Queue_t *, int)");
}

Assistant:

void Msat_QueueInsert( Msat_Queue_t * p, int Lit )
{
    if ( p->iLast == p->nVars )
    {
        int i;
        assert( 0 );
        for ( i = 0; i < p->iLast; i++ )
            printf( "entry = %2d  lit = %2d  var = %2d \n", i, p->pVars[i], p->pVars[i]/2 );
    }
    assert( p->iLast < p->nVars );
    p->pVars[p->iLast++] = Lit;
}